

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeNode.h
# Opt level: O0

TreeNode<ObservationHistory> * __thiscall
TreeNode<ObservationHistory>::GetSuccessor(TreeNode<ObservationHistory> *this,LIndex sucI)

{
  bool bVar1;
  EInvalidIndex *this_00;
  mapped_type *ppTVar2;
  key_type *in_RDI;
  map<unsigned_long_long,_TreeNode<ObservationHistory>_*,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_TreeNode<ObservationHistory>_*>_>_>
  *unaff_retaddr;
  map<unsigned_long_long,_TreeNode<ObservationHistory>_*,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_TreeNode<ObservationHistory>_*>_>_>
  *in_stack_ffffffffffffffb8;
  _Self local_20;
  _Self local_18 [2];
  
  local_18[0]._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long_long,_TreeNode<ObservationHistory>_*,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_TreeNode<ObservationHistory>_*>_>_>
       ::find(in_stack_ffffffffffffffb8,(key_type *)0x9ae636);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long_long,_TreeNode<ObservationHistory>_*,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_TreeNode<ObservationHistory>_*>_>_>
       ::end(in_stack_ffffffffffffffb8);
  bVar1 = std::operator==(local_18,&local_20);
  if (!bVar1) {
    ppTVar2 = std::
              map<unsigned_long_long,_TreeNode<ObservationHistory>_*,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_TreeNode<ObservationHistory>_*>_>_>
              ::operator[](unaff_retaddr,in_RDI);
    return *ppTVar2;
  }
  this_00 = (EInvalidIndex *)__cxa_allocate_exception(0x28);
  EInvalidIndex::EInvalidIndex(this_00,(char *)in_stack_ffffffffffffffb8);
  __cxa_throw(this_00,&EInvalidIndex::typeinfo,EInvalidIndex::~EInvalidIndex);
}

Assistant:

TreeNode<Tcontained>* TreeNode<Tcontained>::GetSuccessor(LIndex sucI)
{
    if(_m_successor.find(sucI)==_m_successor.end())
        throw EInvalidIndex("TreeNode::GetSuccessor successor not found");
    else
        return(_m_successor[sucI]);
}